

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::substring::
     mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                *stack,char *T,iterator PA,iterator first,iterator last,value_type depth)

{
  char cVar1;
  iterator __b;
  iterator __a;
  iterator first_00;
  iterator PA_00;
  iterator last_00;
  iterator last_01;
  iterator SA;
  iterator first_01;
  iterator first_02;
  iterator first_03;
  iterator last_02;
  iterator PA_01;
  iterator PA_02;
  iterator PA_03;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_00;
  iterator a_00;
  iterator last_03;
  iterator b_00;
  iterator first2;
  iterator a_01;
  iterator first1;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_01;
  iterator first_04;
  iterator b_01;
  iterator a_02;
  iterator b_02;
  iterator a_03;
  iterator b_03;
  iterator a_04;
  iterator b_04;
  iterator a_05;
  iterator b_05;
  iterator a_06;
  iterator a_07;
  iterator b_06;
  iterator a_08;
  iterator a_09;
  iterator a_10;
  iterator b_07;
  iterator a_11;
  iterator PA_04;
  iterator PA_05;
  iterator b_08;
  iterator a_12;
  iterator a_13;
  iterator PA_06;
  BitmapArray<long> *pBVar2;
  pos_type pVar3;
  bool bVar4;
  difference_type dVar5;
  reference __src;
  long lVar6;
  difference_type dVar7;
  int iVar8;
  char *in_RCX;
  BitmapArray<long> *in_RDX;
  long in_RSI;
  BitmapArray<long> *in_R8;
  BitmapArray<long> *in_R9;
  value_type *in_stack_00000018;
  char *Td;
  stackinfo_type tempinfo;
  int limit;
  value_type x;
  value_type v;
  iterator c;
  iterator b;
  iterator a;
  value_type *in_stack_fffffffffffff698;
  undefined4 uVar10;
  value_type *pvVar9;
  BitmapArray<long> *in_stack_fffffffffffff6a0;
  BitmapArray<long> *pBVar11;
  iterator *in_stack_fffffffffffff6a8;
  iterator *piVar12;
  iterator *in_stack_fffffffffffff6b0;
  BitmapArray<long> *in_stack_fffffffffffff6b8;
  pos_type in_stack_fffffffffffff6c0;
  BitmapArray<long> *in_stack_fffffffffffff6c8;
  BitmapArray<long> *in_stack_fffffffffffff6d0;
  BitmapArray<long> *in_stack_fffffffffffff7c8;
  BitmapArray<long> *in_stack_fffffffffffff7d0;
  BitmapArray<long> *in_stack_fffffffffffff7d8;
  iterator *this;
  BitmapArray<long> *in_stack_fffffffffffff7e8;
  pos_type in_stack_fffffffffffff7f0;
  BitmapArray<long> *in_stack_fffffffffffff7f8;
  BitmapArray<long> *in_stack_fffffffffffff800;
  BitmapArray<long> *in_stack_fffffffffffff808;
  char *in_stack_fffffffffffff810;
  iterator in_stack_fffffffffffff818;
  reference in_stack_fffffffffffff828;
  BitmapArray<long> *in_stack_fffffffffffff8b0;
  BitmapArray<long> *in_stack_fffffffffffff8b8;
  BitmapArray<long> *in_stack_fffffffffffff8c0;
  BitmapArray<long> *in_stack_fffffffffffff8c8;
  BitmapArray<long> *in_stack_fffffffffffff8d0;
  BitmapArray<long> *in_stack_fffffffffffff8d8;
  iterator in_stack_fffffffffffff8f0;
  BitmapArray<long> *in_stack_fffffffffffff900;
  BitmapArray<long> *in_stack_fffffffffffff908;
  iterator *in_stack_fffffffffffff910;
  BitmapArray<long> *in_stack_fffffffffffff918;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> in_stack_fffffffffffff930;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_688;
  BitmapArray<long> *local_658;
  BitmapArray<long> *local_650;
  BitmapArray<long> *local_648;
  BitmapArray<long> *local_640;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_638;
  BitmapArray<long> *local_608;
  iterator *local_600;
  BitmapArray<long> *local_5f8;
  pos_type local_5f0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_5e8;
  BitmapArray<long> *local_5b8;
  BitmapArray<long> *local_5b0;
  BitmapArray<long> *local_5a8;
  BitmapArray<long> *local_5a0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_598;
  BitmapArray<long> *local_568;
  pos_type local_560;
  BitmapArray<long> *local_558;
  iterator *local_550;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_548;
  BitmapArray<long> *local_518;
  iterator *local_510;
  BitmapArray<long> *local_508;
  pos_type local_500;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_4f8;
  BitmapArray<long> *local_4c8;
  pos_type local_4c0;
  BitmapArray<long> *local_4b8;
  iterator *local_4b0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_4a8;
  BitmapArray<long> *local_478;
  pos_type local_470;
  BitmapArray<long> *local_468;
  iterator *local_460;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_458;
  BitmapArray<long> *local_428;
  iterator *local_420;
  BitmapArray<long> *local_418;
  pos_type local_410;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_408;
  BitmapArray<long> *local_3d8;
  iterator *local_3d0;
  BitmapArray<long> *local_3c8;
  BitmapArray<long> *local_3c0;
  BitmapArray<long> *local_3b8;
  char *local_3b0;
  reference local_3a8;
  reference local_398;
  reference local_388;
  reference local_378;
  iterator local_368;
  reference local_358;
  reference local_348;
  BitmapArray<long> *local_338;
  pos_type local_330;
  iterator local_328;
  BitmapArray<long> *local_318;
  BitmapArray<long> *local_310;
  BitmapArray<long> *local_308;
  char *local_300;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> local_2f8;
  BitmapArray<long> *local_2e0;
  BitmapArray<long> *local_2d8;
  BitmapArray<long> *local_2d0;
  BitmapArray<long> *local_2c8;
  BitmapArray<long> *local_2c0;
  pos_type local_2b8;
  BitmapArray<long> *local_2b0;
  BitmapArray<long> *local_2a8;
  BitmapArray<long> *local_2a0;
  char *local_298;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> local_290;
  iterator local_278;
  BitmapArray<long> *local_268;
  BitmapArray<long> *local_260;
  BitmapArray<long> *local_258;
  BitmapArray<long> *local_250;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_248;
  BitmapArray<long> *local_218;
  pos_type local_210;
  BitmapArray<long> *local_208;
  BitmapArray<long> *local_200;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
  local_1f8;
  BitmapArray<long> *local_1c8;
  BitmapArray<long> *local_1c0;
  BitmapArray<long> *local_1b8;
  BitmapArray<long> *local_1b0;
  BitmapArray<long> *local_1a8;
  char *local_1a0;
  iterator local_198;
  reference local_188;
  reference local_178;
  reference local_168;
  reference local_158;
  reference local_148;
  reference local_138;
  iterator local_128;
  BitmapArray<long> *local_118;
  BitmapArray<long> *local_110;
  BitmapArray<long> *local_108;
  char *local_100;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> local_f8;
  BitmapArray<long> *local_e0;
  iterator local_d8;
  iterator iStack_c8;
  value_type *local_b8;
  int local_b0;
  value_type *local_a8;
  BitmapArray<long> *local_a0;
  BitmapArray<long> *local_98;
  BitmapArray<long> *local_90;
  BitmapArray<long> *local_88;
  char *local_80;
  int local_78;
  char local_72;
  char local_71;
  undefined1 local_70 [24];
  pos_type local_58;
  iterator local_50;
  long local_40;
  iterator local_30;
  BitmapArray<long> *local_20;
  char *local_18;
  
  this = (iterator *)&stack0x00000008;
  local_40 = in_RSI;
  local_30.array_ = in_R8;
  local_30.pos_ = (pos_type)in_R9;
  local_20 = in_RDX;
  local_18 = in_RCX;
  bitmap::BitmapArray<long>::iterator::iterator(&local_50);
  bitmap::BitmapArray<long>::iterator::iterator((iterator *)(local_70 + 0x10));
  bitmap::BitmapArray<long>::iterator::iterator((iterator *)local_70);
  dVar5 = bitmap::BitmapArray<long>::iterator::operator-(this,&local_30);
  local_78 = helper::lg<long>(dVar5);
  do {
    while( true ) {
      while (dVar5 = bitmap::BitmapArray<long>::iterator::operator-(this,&local_30), dVar5 < 9) {
        dVar5 = bitmap::BitmapArray<long>::iterator::operator-(this,&local_30);
        if (1 < dVar5) {
          local_88 = local_20;
          local_80 = local_18;
          local_98 = local_30.array_;
          local_90 = (BitmapArray<long> *)local_30.pos_;
          in_stack_fffffffffffff698 = (value_type *)this->array_;
          in_stack_fffffffffffff6a0 = (BitmapArray<long> *)this->pos_;
          PA_00.pos_ = in_stack_fffffffffffff7f0;
          PA_00.array_ = in_stack_fffffffffffff7e8;
          first_00.pos_ = (pos_type)this;
          first_00.array_ = in_stack_fffffffffffff7d8;
          last_02.pos_ = (pos_type)in_stack_fffffffffffff808;
          last_02.array_ = in_stack_fffffffffffff800;
          local_a8 = in_stack_fffffffffffff698;
          local_a0 = in_stack_fffffffffffff6a0;
          insertionsort<char*,bitmap::BitmapArray<long>::iterator>
                    ((char *)in_stack_fffffffffffff7d0,PA_00,first_00,last_02,
                     (value_type)in_stack_fffffffffffff7c8);
        }
        bVar4 = std::
                stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                ::empty((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                         *)0x113edb);
        if (bVar4) {
          return;
        }
        __src = std::
                stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                ::top((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                       *)0x113ef9);
        memcpy(&local_d8,__src,0x30);
        bitmap::BitmapArray<long>::iterator::operator=(&local_30,&local_d8);
        bitmap::BitmapArray<long>::iterator::operator=(this,&iStack_c8);
        in_stack_00000018 = local_b8;
        local_78 = local_b0;
        std::
        stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
        ::pop((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
               *)0x113f67);
      }
      local_e0 = (BitmapArray<long> *)((long)&(in_stack_00000018->m_a).array_ + local_40);
      iVar8 = local_78 + -1;
      bVar4 = local_78 == 0;
      local_78 = iVar8;
      if (bVar4) {
        local_108 = local_20;
        local_100 = local_18;
        PA_06.pos_ = (pos_type)local_18;
        PA_06.array_ = local_20;
        substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::substring_wrapper
                  (&local_f8,(char *)local_e0,PA_06);
        local_118 = local_30.array_;
        local_110 = (BitmapArray<long> *)local_30.pos_;
        bitmap::BitmapArray<long>::iterator::operator-(this,&local_30);
        Td_00.m_PA = in_stack_fffffffffffff818;
        Td_00.m_Td = in_stack_fffffffffffff810;
        SA.pos_ = (pos_type)in_stack_fffffffffffff800;
        SA.array_ = in_stack_fffffffffffff7f8;
        in_stack_fffffffffffff698 = (value_type *)local_f8.m_Td;
        in_stack_fffffffffffff6a0 = local_f8.m_PA.array_;
        in_stack_fffffffffffff6a8 = (iterator *)local_f8.m_PA.pos_;
        helper::
        heapsort<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                  (Td_00,SA,in_stack_fffffffffffff7f0);
      }
      if (local_78 < 0) break;
      local_2a0 = local_20;
      local_298 = local_18;
      PA_05.pos_ = (pos_type)local_18;
      PA_05.array_ = local_20;
      substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::substring_wrapper
                (&local_290,(char *)local_e0,PA_05);
      local_2b0 = local_30.array_;
      local_2a8 = (BitmapArray<long> *)local_30.pos_;
      local_2c0 = this->array_;
      local_2b8 = this->pos_;
      first_04.pos_ = (pos_type)in_stack_fffffffffffff908;
      first_04.array_ = in_stack_fffffffffffff900;
      pBVar11 = local_290.m_PA.array_;
      piVar12 = (iterator *)local_290.m_PA.pos_;
      local_278 = helper::
                  pivot<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                            (in_stack_fffffffffffff930,first_04,in_stack_fffffffffffff8f0);
      bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_278);
      local_2d0 = local_30.array_;
      local_2c8 = (BitmapArray<long> *)local_30.pos_;
      local_2e0 = local_50.array_;
      local_2d8 = (BitmapArray<long> *)local_50.pos_;
      __a.pos_ = (pos_type)in_stack_fffffffffffff6d0;
      __a.array_ = in_stack_fffffffffffff6c8;
      __b.pos_ = in_stack_fffffffffffff6c0;
      __b.array_ = in_stack_fffffffffffff6b8;
      std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                (__a,__b);
      local_308 = local_20;
      local_300 = local_18;
      PA_04.pos_ = (pos_type)local_18;
      PA_04.array_ = local_20;
      substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::substring_wrapper
                (&local_2f8,(char *)local_e0,PA_04);
      local_318 = local_30.array_;
      local_310 = (BitmapArray<long> *)local_30.pos_;
      local_328 = bitmap::BitmapArray<long>::iterator::operator+(piVar12,(difference_type)pBVar11);
      pBVar11 = local_e0;
      local_338 = this->array_;
      local_330 = this->pos_;
      local_358 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11486c);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x114889);
      local_348 = bitmap::BitmapArray<long>::iterator::operator[]
                            (in_stack_fffffffffffff6b0,(difference_type)piVar12);
      lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x1148b6);
      in_stack_fffffffffffff6c0 = (long)&(pBVar11->super_Bitmap)._vptr_Bitmap + lVar6;
      in_stack_fffffffffffff6b0 = &local_50;
      in_stack_fffffffffffff6b8 = (BitmapArray<long> *)local_70;
      Td_01.m_PA.pos_ = (pos_type)in_stack_fffffffffffff900;
      Td_01.m_Td = (char *)in_stack_fffffffffffff8f0.array_;
      Td_01.m_PA.array_ = (BitmapArray<long> *)in_stack_fffffffffffff8f0.pos_;
      first1.pos_ = (pos_type)in_stack_fffffffffffff8d8;
      first1.array_ = in_stack_fffffffffffff8d0;
      first2.pos_ = (pos_type)in_stack_fffffffffffff8c8;
      first2.array_ = in_stack_fffffffffffff8c0;
      last_03.pos_ = (pos_type)in_stack_fffffffffffff8b8;
      last_03.array_ = in_stack_fffffffffffff8b0;
      in_stack_fffffffffffff698 = (value_type *)local_2f8.m_Td;
      in_stack_fffffffffffff6a0 = local_2f8.m_PA.array_;
      in_stack_fffffffffffff6a8 = (iterator *)local_2f8.m_PA.pos_;
      bVar4 = helper::
              partition<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                        (Td_01,first1,first2,last_03,(iterator *)in_stack_fffffffffffff908,
                         in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff918);
      pBVar11 = local_e0;
      uVar10 = (undefined4)((ulong)in_stack_fffffffffffff698 >> 0x20);
      if (bVar4) {
        local_388 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x114964);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x114981);
        local_378 = bitmap::BitmapArray<long>::iterator::operator[]
                              (in_stack_fffffffffffff6b0,(difference_type)in_stack_fffffffffffff6a8)
        ;
        lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x1149ae);
        pBVar2 = local_e0;
        cVar1 = *(char *)((long)&(pBVar11->super_Bitmap)._vptr_Bitmap + lVar6);
        local_3a8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1149e1);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1149fe);
        local_398 = bitmap::BitmapArray<long>::iterator::operator[]
                              (in_stack_fffffffffffff6b0,(difference_type)in_stack_fffffffffffff6a8)
        ;
        lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x114a2b);
        if (*(char *)((long)pBVar2 + lVar6 + -1) < cVar1) {
          local_3b8 = local_20;
          local_3b0 = local_18;
          local_3c8 = local_50.array_;
          local_3c0 = (BitmapArray<long> *)local_50.pos_;
          local_3d8 = (BitmapArray<long> *)local_70._0_8_;
          local_3d0 = (iterator *)local_70._8_8_;
          PA_02.pos_ = (pos_type)in_stack_fffffffffffff810;
          PA_02.array_ = in_stack_fffffffffffff808;
          first_02.pos_ = (pos_type)in_stack_fffffffffffff800;
          first_02.array_ = in_stack_fffffffffffff7f8;
          last_01.pos_ = in_stack_fffffffffffff7f0;
          last_01.array_ = in_stack_fffffffffffff7e8;
          pvVar9 = in_stack_00000018;
          local_368 = partition<bitmap::BitmapArray<long>::iterator>
                                (PA_02,first_02,last_01,in_stack_fffffffffffff828.pos_);
          uVar10 = (undefined4)((ulong)pvVar9 >> 0x20);
        }
        else {
          local_368.pos_ = local_50.pos_;
          local_368.array_ = local_50.array_;
        }
        bitmap::BitmapArray<long>::iterator::operator=((iterator *)(local_70 + 0x10),&local_368);
        dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_30);
        dVar7 = bitmap::BitmapArray<long>::iterator::operator-(this,(iterator *)local_70);
        if (dVar7 < dVar5) {
          dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_30);
          dVar7 = bitmap::BitmapArray<long>::iterator::operator-
                            ((iterator *)local_70,(iterator *)(local_70 + 0x10));
          if (dVar7 < dVar5) {
            dVar5 = bitmap::BitmapArray<long>::iterator::operator-(this,(iterator *)local_70);
            dVar7 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)local_70,(iterator *)(local_70 + 0x10));
            if (dVar7 < dVar5) {
              a_01.pos_ = local_30.pos_;
              a_01.array_ = local_30.array_;
              b_00.pos_ = local_50.pos_;
              b_00.array_ = local_50.array_;
              pvVar9 = (value_type *)CONCAT44(uVar10,local_78);
              in_stack_fffffffffffff8b8 = local_50.array_;
              in_stack_fffffffffffff8c0 = (BitmapArray<long> *)local_50.pos_;
              in_stack_fffffffffffff8c8 = local_30.array_;
              in_stack_fffffffffffff8d0 = (BitmapArray<long> *)local_30.pos_;
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
              ::stackinfo4((stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
                            *)&stack0xfffffffffffff8d8,a_01,b_00,(long)in_stack_00000018,local_78);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                      *)in_stack_fffffffffffff6a0,pvVar9);
              a_00.pos_ = local_70._8_8_;
              a_00.array_ = (BitmapArray<long> *)local_70._0_8_;
              in_stack_fffffffffffff698 =
                   (value_type *)CONCAT44((int)((ulong)pvVar9 >> 0x20),local_78);
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
              ::stackinfo4((stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
                            *)&stack0xfffffffffffff888,a_00,*this,(long)in_stack_00000018,local_78);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                      *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
              bitmap::BitmapArray<long>::iterator::operator=
                        (&local_30,(iterator *)(local_70 + 0x10));
              bitmap::BitmapArray<long>::iterator::operator=(this,(iterator *)local_70);
              in_stack_00000018 = (value_type *)((long)&(in_stack_00000018->m_a).array_ + 1);
              dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)local_70,(iterator *)(local_70 + 0x10));
              local_78 = helper::lg<long>(dVar5);
            }
            else {
              a_03.pos_ = local_30.pos_;
              a_03.array_ = local_30.array_;
              b_02.pos_ = local_50.pos_;
              b_02.array_ = local_50.array_;
              pvVar9 = (value_type *)CONCAT44(uVar10,local_78);
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
              ::stackinfo4(&local_688,a_03,b_02,(long)in_stack_00000018,local_78);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                      *)in_stack_fffffffffffff6a0,pvVar9);
              pVar3 = local_58;
              uVar10 = (undefined4)((ulong)pvVar9 >> 0x20);
              piVar12 = &in_stack_00000018->m_a;
              in_stack_fffffffffffff908 = (BitmapArray<long> *)local_70._0_8_;
              in_stack_fffffffffffff910 = (iterator *)local_70._8_8_;
              in_stack_fffffffffffff918 = (BitmapArray<long> *)local_70._16_8_;
              dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)local_70,(iterator *)(local_70 + 0x10));
              iVar8 = helper::lg<long>(dVar5);
              a_02.pos_ = pVar3;
              a_02.array_ = in_stack_fffffffffffff918;
              b_01.pos_ = (pos_type)in_stack_fffffffffffff910;
              b_01.array_ = in_stack_fffffffffffff908;
              in_stack_fffffffffffff698 = (value_type *)CONCAT44(uVar10,iVar8);
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
              ::stackinfo4((stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
                            *)&stack0xfffffffffffff928,a_02,b_01,(long)((long)&piVar12->array_ + 1),
                           iVar8);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                      *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
              bitmap::BitmapArray<long>::iterator::operator=(&local_30,(iterator *)local_70);
            }
          }
          else {
            local_5f8 = (BitmapArray<long> *)local_70._16_8_;
            local_5f0 = local_58;
            local_608 = (BitmapArray<long> *)local_70._0_8_;
            local_600 = (iterator *)local_70._8_8_;
            piVar12 = &in_stack_00000018->m_a;
            dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)local_70,(iterator *)(local_70 + 0x10));
            iVar8 = helper::lg<long>(dVar5);
            a_05.pos_ = local_5f0;
            a_05.array_ = local_5f8;
            b_04.pos_ = (pos_type)local_600;
            b_04.array_ = local_608;
            pvVar9 = (value_type *)CONCAT44(uVar10,iVar8);
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
            ::stackinfo4(&local_5e8,a_05,b_04,(long)((long)&piVar12->array_ + 1),iVar8);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                    *)in_stack_fffffffffffff6a0,pvVar9);
            local_648 = local_30.array_;
            local_640 = (BitmapArray<long> *)local_30.pos_;
            local_658 = local_50.array_;
            local_650 = (BitmapArray<long> *)local_50.pos_;
            a_04.pos_ = local_30.pos_;
            a_04.array_ = local_30.array_;
            b_03.pos_ = local_50.pos_;
            b_03.array_ = local_50.array_;
            in_stack_fffffffffffff698 =
                 (value_type *)CONCAT44((int)((ulong)pvVar9 >> 0x20),local_78);
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
            ::stackinfo4(&local_638,a_04,b_03,(long)in_stack_00000018,local_78);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                    *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
            bitmap::BitmapArray<long>::iterator::operator=(&local_30,(iterator *)local_70);
          }
        }
        else {
          dVar5 = bitmap::BitmapArray<long>::iterator::operator-(this,(iterator *)local_70);
          dVar7 = bitmap::BitmapArray<long>::iterator::operator-
                            ((iterator *)local_70,(iterator *)(local_70 + 0x10));
          if (dVar7 < dVar5) {
            dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_30);
            dVar7 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)local_70,(iterator *)(local_70 + 0x10));
            if (dVar7 < dVar5) {
              local_558 = (BitmapArray<long> *)local_70._0_8_;
              local_550 = (iterator *)local_70._8_8_;
              local_568 = this->array_;
              local_560 = this->pos_;
              a_07.pos_ = local_70._8_8_;
              a_07.array_ = (BitmapArray<long> *)local_70._0_8_;
              pvVar9 = (value_type *)CONCAT44(uVar10,local_78);
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
              ::stackinfo4(&local_548,a_07,*this,(long)in_stack_00000018,local_78);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                      *)in_stack_fffffffffffff6a0,pvVar9);
              local_5a8 = local_30.array_;
              local_5a0 = (BitmapArray<long> *)local_30.pos_;
              local_5b8 = local_50.array_;
              local_5b0 = (BitmapArray<long> *)local_50.pos_;
              a_06.pos_ = local_30.pos_;
              a_06.array_ = local_30.array_;
              b_05.pos_ = local_50.pos_;
              b_05.array_ = local_50.array_;
              in_stack_fffffffffffff698 =
                   (value_type *)CONCAT44((int)((ulong)pvVar9 >> 0x20),local_78);
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
              ::stackinfo4(&local_598,a_06,b_05,(long)in_stack_00000018,local_78);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                      *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
              bitmap::BitmapArray<long>::iterator::operator=
                        (&local_30,(iterator *)(local_70 + 0x10));
              bitmap::BitmapArray<long>::iterator::operator=(this,(iterator *)local_70);
              in_stack_00000018 = (value_type *)((long)&(in_stack_00000018->m_a).array_ + 1);
              dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)local_70,(iterator *)(local_70 + 0x10));
              local_78 = helper::lg<long>(dVar5);
            }
            else {
              local_4b8 = (BitmapArray<long> *)local_70._0_8_;
              local_4b0 = (iterator *)local_70._8_8_;
              local_4c8 = this->array_;
              local_4c0 = this->pos_;
              a_09.pos_ = local_70._8_8_;
              a_09.array_ = (BitmapArray<long> *)local_70._0_8_;
              pvVar9 = (value_type *)CONCAT44(uVar10,local_78);
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
              ::stackinfo4(&local_4a8,a_09,*this,(long)in_stack_00000018,local_78);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                      *)in_stack_fffffffffffff6a0,pvVar9);
              uVar10 = (undefined4)((ulong)pvVar9 >> 0x20);
              local_508 = (BitmapArray<long> *)local_70._16_8_;
              local_500 = local_58;
              local_518 = (BitmapArray<long> *)local_70._0_8_;
              local_510 = (iterator *)local_70._8_8_;
              piVar12 = &in_stack_00000018->m_a;
              dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                                ((iterator *)local_70,(iterator *)(local_70 + 0x10));
              iVar8 = helper::lg<long>(dVar5);
              a_08.pos_ = local_500;
              a_08.array_ = local_508;
              b_06.pos_ = (pos_type)local_510;
              b_06.array_ = local_518;
              in_stack_fffffffffffff698 = (value_type *)CONCAT44(uVar10,iVar8);
              helper::
              stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
              ::stackinfo4(&local_4f8,a_08,b_06,(long)((long)&piVar12->array_ + 1),iVar8);
              std::
              stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                      *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
              bitmap::BitmapArray<long>::iterator::operator=(this,&local_50);
            }
          }
          else {
            local_418 = (BitmapArray<long> *)local_70._16_8_;
            local_410 = local_58;
            local_428 = (BitmapArray<long> *)local_70._0_8_;
            local_420 = (iterator *)local_70._8_8_;
            piVar12 = &in_stack_00000018->m_a;
            dVar5 = bitmap::BitmapArray<long>::iterator::operator-
                              ((iterator *)local_70,(iterator *)(local_70 + 0x10));
            iVar8 = helper::lg<long>(dVar5);
            a_11.pos_ = local_410;
            a_11.array_ = local_418;
            b_07.pos_ = (pos_type)local_420;
            b_07.array_ = local_428;
            pvVar9 = (value_type *)CONCAT44(uVar10,iVar8);
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
            ::stackinfo4(&local_408,a_11,b_07,(long)((long)&piVar12->array_ + 1),iVar8);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                    *)in_stack_fffffffffffff6a0,pvVar9);
            local_468 = (BitmapArray<long> *)local_70._0_8_;
            local_460 = (iterator *)local_70._8_8_;
            local_478 = this->array_;
            local_470 = this->pos_;
            a_10.pos_ = local_70._8_8_;
            a_10.array_ = (BitmapArray<long> *)local_70._0_8_;
            in_stack_fffffffffffff698 =
                 (value_type *)CONCAT44((int)((ulong)pvVar9 >> 0x20),local_78);
            helper::
            stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
            ::stackinfo4(&local_458,a_10,*this,(long)in_stack_00000018,local_78);
            std::
            stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
            ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                    *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
            bitmap::BitmapArray<long>::iterator::operator=(this,&local_50);
          }
        }
      }
      else {
        local_78 = local_78 + 1;
        in_stack_fffffffffffff6c8 = local_e0;
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x115623);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x115640);
        bitmap::BitmapArray<long>::iterator::operator[]
                  (in_stack_fffffffffffff6b0,(difference_type)in_stack_fffffffffffff6a8);
        lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x11566d);
        cVar1 = *(char *)((long)in_stack_fffffffffffff6c8 + lVar6 + -1);
        in_stack_fffffffffffff6d0 = local_e0;
        in_stack_fffffffffffff828 =
             bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11569b);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1156b8);
        bitmap::BitmapArray<long>::iterator::operator[]
                  (in_stack_fffffffffffff6b0,(difference_type)in_stack_fffffffffffff6a8);
        lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x1156e5);
        if (cVar1 < *(char *)((long)&(in_stack_fffffffffffff6d0->super_Bitmap)._vptr_Bitmap + lVar6)
           ) {
          in_stack_fffffffffffff7e8 = this->array_;
          in_stack_fffffffffffff7f0 = this->pos_;
          PA_03.pos_ = (pos_type)local_18;
          PA_03.array_ = local_20;
          first_03.pos_ = local_30.pos_;
          first_03.array_ = local_30.array_;
          in_stack_fffffffffffff698 = in_stack_00000018;
          in_stack_fffffffffffff7f8 = local_30.array_;
          in_stack_fffffffffffff800 = (BitmapArray<long> *)local_30.pos_;
          in_stack_fffffffffffff808 = local_20;
          in_stack_fffffffffffff810 = local_18;
          in_stack_fffffffffffff818 =
               partition<bitmap::BitmapArray<long>::iterator>
                         (PA_03,first_03,*this,in_stack_fffffffffffff828.pos_);
          bitmap::BitmapArray<long>::iterator::operator=
                    (&local_30,(iterator *)&stack0xfffffffffffff818);
          dVar5 = bitmap::BitmapArray<long>::iterator::operator-(this,&local_30);
          local_78 = helper::lg<long>(dVar5);
        }
        in_stack_00000018 = (value_type *)((long)&(in_stack_00000018->m_a).array_ + 1);
      }
    }
    local_128 = bitmap::BitmapArray<long>::iterator::operator+
                          (in_stack_fffffffffffff6a8,(difference_type)in_stack_fffffffffffff6a0);
    bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_128);
    in_stack_fffffffffffff7d8 = local_e0;
    local_148 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1140b5);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1140d2);
    local_138 = bitmap::BitmapArray<long>::iterator::operator[]
                          (in_stack_fffffffffffff6b0,(difference_type)in_stack_fffffffffffff6a8);
    lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1140ff)
    ;
    local_71 = *(char *)((long)&(in_stack_fffffffffffff7d8->super_Bitmap)._vptr_Bitmap + lVar6);
    while (bVar4 = bitmap::BitmapArray<long>::iterator::operator<(&local_50,this), bVar4) {
      in_stack_fffffffffffff7d0 = local_e0;
      local_168 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11414f);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11416c);
      local_158 = bitmap::BitmapArray<long>::iterator::operator[]
                            (in_stack_fffffffffffff6b0,(difference_type)in_stack_fffffffffffff6a8);
      lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x114199);
      local_72 = *(char *)((long)&(in_stack_fffffffffffff7d0->super_Bitmap)._vptr_Bitmap + lVar6);
      if (local_72 != local_71) {
        dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_30);
        if (1 < dVar5) break;
        local_71 = local_72;
        bitmap::BitmapArray<long>::iterator::operator=(&local_30,&local_50);
      }
      bitmap::BitmapArray<long>::iterator::operator++(&local_50);
    }
    in_stack_fffffffffffff7c8 = local_e0;
    local_188 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x114235);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x114252);
    local_178 = bitmap::BitmapArray<long>::iterator::operator[]
                          (in_stack_fffffffffffff6b0,(difference_type)in_stack_fffffffffffff6a8);
    lVar6 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11427f)
    ;
    if (*(char *)((long)in_stack_fffffffffffff7c8 + lVar6 + -1) < local_71) {
      local_1a8 = local_20;
      local_1a0 = local_18;
      local_1b8 = local_30.array_;
      local_1b0 = (BitmapArray<long> *)local_30.pos_;
      local_1c8 = local_50.array_;
      local_1c0 = (BitmapArray<long> *)local_50.pos_;
      PA_01.pos_ = (pos_type)in_stack_fffffffffffff810;
      PA_01.array_ = in_stack_fffffffffffff808;
      first_01.pos_ = (pos_type)in_stack_fffffffffffff800;
      first_01.array_ = in_stack_fffffffffffff7f8;
      last_00.pos_ = in_stack_fffffffffffff7f0;
      last_00.array_ = in_stack_fffffffffffff7e8;
      in_stack_fffffffffffff698 = in_stack_00000018;
      local_198 = partition<bitmap::BitmapArray<long>::iterator>
                            (PA_01,first_01,last_00,in_stack_fffffffffffff828.pos_);
      bitmap::BitmapArray<long>::iterator::operator=(&local_30,&local_198);
    }
    dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_30);
    dVar7 = bitmap::BitmapArray<long>::iterator::operator-(this,&local_50);
    if (dVar7 < dVar5) {
      dVar5 = bitmap::BitmapArray<long>::iterator::operator-(this,&local_50);
      uVar10 = (undefined4)((ulong)in_stack_fffffffffffff698 >> 0x20);
      if (dVar5 < 2) {
        bitmap::BitmapArray<long>::iterator::operator=(this,&local_50);
        in_stack_00000018 = (value_type *)((long)&(in_stack_00000018->m_a).array_ + 1);
        dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_30);
        local_78 = helper::lg<long>(dVar5);
      }
      else {
        local_258 = local_30.array_;
        local_250 = (BitmapArray<long> *)local_30.pos_;
        local_268 = local_50.array_;
        local_260 = (BitmapArray<long> *)local_50.pos_;
        piVar12 = &in_stack_00000018->m_a;
        dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_30);
        iVar8 = helper::lg<long>(dVar5);
        a_12.pos_ = (pos_type)local_250;
        a_12.array_ = local_258;
        b_08.pos_ = (pos_type)local_260;
        b_08.array_ = local_268;
        in_stack_fffffffffffff698 = (value_type *)CONCAT44(uVar10,iVar8);
        helper::
        stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
        ::stackinfo4(&local_248,a_12,b_08,(long)((long)&piVar12->array_ + 1),iVar8);
        std::
        stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
        ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
        bitmap::BitmapArray<long>::iterator::operator=(&local_30,&local_50);
        local_78 = -1;
      }
    }
    else {
      dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_30);
      if (dVar5 < 2) {
        bitmap::BitmapArray<long>::iterator::operator=(&local_30,&local_50);
        local_78 = -1;
      }
      else {
        local_208 = local_50.array_;
        local_200 = (BitmapArray<long> *)local_50.pos_;
        local_218 = this->array_;
        local_210 = this->pos_;
        a_13.pos_ = local_50.pos_;
        a_13.array_ = local_50.array_;
        in_stack_fffffffffffff698 =
             (value_type *)CONCAT44((int)((ulong)in_stack_fffffffffffff698 >> 0x20),0xffffffff);
        helper::
        stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>
        ::stackinfo4(&local_1f8,a_13,*this,(long)in_stack_00000018,-1);
        std::
        stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
        ::push((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
                *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
        bitmap::BitmapArray<long>::iterator::operator=(this,&local_50);
        in_stack_00000018 = (value_type *)((long)&(in_stack_00000018->m_a).array_ + 1);
        dVar5 = bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_30);
        local_78 = helper::lg<long>(dVar5);
      }
    }
  } while( true );
}

Assistant:

void mintrosort(
    stack_type &stack, const StringIterator_type T, const SAIterator_type PA,
    SAIterator_type first, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  typedef substring_wrapper<StringIterator_type, SAIterator_type> wrapper_type;
  typedef typename stack_type::value_type stackinfo_type;

  SAIterator_type a, b, c;
  value_type v, x;
  int limit;

  for (limit = helper::lg(last - first);;) {

    if ((last - first) <= 8) {
      if (1 < (last - first)) {
        insertionsort(T, PA, first, last, depth);
      }
      STACK_POP4(first, last, depth, limit);
      continue;
    }

    const StringIterator_type Td = T + depth;
    if (limit-- == 0) {
      helper::heapsort(wrapper_type(Td, PA), first, last - first);
    }
    if (limit < 0) {
      for (a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if ((x = Td[PA[*a]]) != v) {
          if (1 < (a - first)) {
            break;
          }
          v = x;
          first = a;
        }
      }
      if (Td[PA[*first] - 1] < v) {
        first = partition(PA, first, a, depth);
      }
      if ((a - first) <= (last - a)) {
        if (1 < (a - first)) {
          STACK_PUSH4(a, last, depth, -1);
          last = a, depth += 1, limit = helper::lg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if (1 < (last - a)) {
          STACK_PUSH4(first, a, depth + 1, helper::lg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = helper::lg(a - first);
        }
      }
      continue;
    }

    /* partition */
    a = helper::pivot(wrapper_type(Td, PA), first, last);
    std::iter_swap(first, a);
    if (helper::partition(wrapper_type(Td, PA), first, first + 1, last, a, c,
                          Td[PA[*first]]) != false) {
      b = (Td[PA[*a]] <= Td[PA[*a] - 1]) ? a : partition(PA, a, c, depth);

      if ((a - first) <= (last - c)) {
        if ((last - c) <= (c - b)) {
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          STACK_PUSH4(c, last, depth, limit);
          last = a;
        } else if ((a - first) <= (c - b)) {
          STACK_PUSH4(c, last, depth, limit);
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          last = a;
        } else {
          STACK_PUSH4(c, last, depth, limit);
          STACK_PUSH4(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = helper::lg(c - b);
        }
      } else {
        if ((a - first) <= (c - b)) {
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          STACK_PUSH4(first, a, depth, limit);
          first = c;
        } else if ((last - c) <= (c - b)) {
          STACK_PUSH4(first, a, depth, limit);
          STACK_PUSH4(b, c, depth + 1, helper::lg(c - b));
          first = c;
        } else {
          STACK_PUSH4(first, a, depth, limit);
          STACK_PUSH4(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = helper::lg(c - b);
        }
      }
    } else {
      limit += 1;
      if (Td[PA[*first] - 1] < Td[PA[*first]]) {
        first = partition(PA, first, last, depth);
        limit = helper::lg(last - first);
      }
      depth += 1;
    }
  }
}